

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCallsList_onlyKeepExpectationsRelatedTo_Test::
TEST_MockExpectedCallsList_onlyKeepExpectationsRelatedTo_Test
          (TEST_MockExpectedCallsList_onlyKeepExpectationsRelatedTo_Test *this)

{
  TEST_MockExpectedCallsList_onlyKeepExpectationsRelatedTo_Test *this_local;
  
  memset(this,0,0x30);
  TEST_GROUP_CppUTestGroupMockExpectedCallsList::TEST_GROUP_CppUTestGroupMockExpectedCallsList
            (&this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList);
  (this->super_TEST_GROUP_CppUTestGroupMockExpectedCallsList).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_MockExpectedCallsList_onlyKeepExpectationsRelatedTo_Test_00329ee8;
  return;
}

Assistant:

TEST(MockExpectedCallsList, onlyKeepExpectationsRelatedTo)
{
    call1->withName("relate");
    call2->withName("unrelate");
    call3->withName("unrelate");
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    list->addExpectedCall(call3);
    list->onlyKeepExpectationsRelatedTo("relate");
    LONGS_EQUAL(1, list->size());
}